

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unicode.cpp
# Opt level: O0

vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
* unicode_regex_split(string *text,
                     vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *regex_exprs)

{
  initializer_list<unsigned_long> __l;
  initializer_list<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>
  __l_00;
  initializer_list<std::pair<const_int,_int>_> __l_01;
  initializer_list<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  __l_02;
  value_type vVar1;
  mapped_type_conflict1 mVar2;
  bool bVar3;
  uint16_t uVar4;
  int iVar5;
  size_type sVar6;
  const_reference pvVar7;
  undefined1 *puVar8;
  mapped_type_conflict1 *pmVar9;
  long lVar10;
  runtime_error *this;
  ulong uVar11;
  char *pcVar12;
  ulong uVar13;
  mapped_type *pmVar14;
  iterator ppVar15;
  int *piVar16;
  reference this_00;
  undefined8 in_RDX;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_RDI;
  size_t i_4;
  size_t *offset;
  iterator __end1_2;
  iterator __begin1_2;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *__range1_2;
  size_t start;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  bpe_words;
  regex_error *e;
  size_t i_3;
  wstring wtext;
  wstring wregex_expr;
  string pat;
  size_t i_2;
  bool inside;
  string regex_expr_collapsed;
  size_t i_1;
  vector<unsigned_int,_std::allocator<unsigned_int>_> cpts_regex;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>
  *ucat_1;
  const_iterator __end2_1;
  const_iterator __begin2_1;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
  *__range2_1;
  bool use_collapsed;
  vector<unsigned_long,_std::allocator<unsigned_long>_> tmp;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *regex_expr_1;
  const_iterator __end1_1;
  const_iterator __begin1_1;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range1_1;
  vector<unsigned_long,_std::allocator<unsigned_long>_> bpe_offsets;
  unicode_cpt_flags flags;
  size_t i;
  string text_collapsed;
  vector<unsigned_int,_std::allocator<unsigned_int>_> cpts;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>
  *ucat;
  const_iterator __end2;
  const_iterator __begin2;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
  *__range2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *regex_expr;
  const_iterator __end1;
  const_iterator __begin1;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range1;
  bool need_collapse;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
  *in_stack_fffffffffffff918;
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *in_stack_fffffffffffff920;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *this_01;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *in_stack_fffffffffffff928;
  uint32_t in_stack_fffffffffffff930;
  undefined4 in_stack_fffffffffffff934;
  undefined4 in_stack_fffffffffffff938;
  uint32_t in_stack_fffffffffffff93c;
  basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>
  *in_stack_fffffffffffff940;
  __normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
  in_stack_fffffffffffff948;
  __normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
  in_stack_fffffffffffff950;
  undefined6 in_stack_fffffffffffff958;
  undefined2 in_stack_fffffffffffff95e;
  allocator_type *in_stack_fffffffffffff960;
  undefined7 in_stack_fffffffffffff968;
  undefined1 in_stack_fffffffffffff96f;
  map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *in_stack_fffffffffffff970;
  iterator in_stack_fffffffffffff978;
  string *in_stack_fffffffffffff980;
  string *in_stack_fffffffffffff988;
  string *in_stack_fffffffffffff998;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_stack_fffffffffffffa28;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *in_stack_fffffffffffffa78;
  wstring *in_stack_fffffffffffffa80;
  wstring *in_stack_fffffffffffffa88;
  wstring *local_568;
  undefined8 ***local_540;
  string local_520 [32];
  ulong local_500;
  reference local_4f8;
  unsigned_long *local_4f0;
  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  local_4e8;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *local_4e0;
  ulong local_4d8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_4d0 [2];
  unicode_cpt_flags local_492;
  iterator local_490;
  undefined1 local_481 [9];
  uint *local_478;
  wstring local_470 [32];
  wstring local_450 [56];
  _Self local_418;
  _Self local_410;
  string local_408 [32];
  ulong local_3e8;
  byte local_3d9;
  string local_3d8 [32];
  ulong local_3b8;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_3b0;
  reference local_398;
  _Self local_390;
  _Self local_388;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
  *local_380;
  byte local_375;
  int local_374;
  reference local_358;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_350;
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_348;
  undefined8 local_340;
  size_type local_330;
  size_type *local_328;
  undefined8 local_320;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_318;
  uint local_2fc;
  _Self local_2f8;
  uint local_2ec;
  _Self local_2e8;
  unicode_cpt_flags local_2da;
  ulong local_2d8;
  string local_2d0 [32];
  string local_2b0;
  _Self local_290;
  _Self local_288;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
  *local_280;
  reference local_278;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_270;
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_268;
  undefined8 local_260;
  byte local_257;
  undefined4 local_254;
  undefined4 local_250;
  undefined4 local_24c;
  undefined4 local_248;
  undefined4 local_244;
  wstring *local_240;
  wstring local_238;
  undefined1 local_210 [40];
  undefined1 local_1e8 [40];
  undefined1 local_1c0 [40];
  undefined1 local_198 [40];
  wstring *local_170;
  size_type local_168;
  undefined8 local_158;
  undefined8 uStack_150;
  undefined8 local_148;
  undefined8 uStack_140;
  undefined8 local_138;
  undefined8 *local_130;
  undefined8 local_128;
  undefined4 local_11c;
  undefined4 local_118;
  undefined4 local_114;
  undefined4 local_110;
  undefined4 local_fc;
  undefined1 ***local_f8;
  undefined8 **local_f0 [5];
  undefined1 local_c8 [40];
  undefined1 local_a0 [40];
  undefined1 local_78 [40];
  undefined1 local_50 [40];
  undefined1 ***local_28;
  undefined8 local_20;
  undefined8 local_18;
  
  local_18 = in_RDX;
  if ((unicode_regex_split(std::__cxx11::string_const&,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&)
       ::k_ucat_enum_abi_cxx11_ == '\0') &&
     (iVar5 = __cxa_guard_acquire(&unicode_regex_split(std::__cxx11::string_const&,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&)
                                   ::k_ucat_enum_abi_cxx11_), iVar5 != 0)) {
    local_f8 = (undefined1 ***)local_f0;
    local_fc = 2;
    std::
    pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>
    ::
    pair<const_char_(&)[6],_unicode_cpt_flags::(unnamed_enum_at__workspace_llm4binary_github_license_c_cmakelists_ggerganov[P]llama_src_unicode_h:8:5),_true>
              ((pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>
                *)in_stack_fffffffffffff950._M_current,
               (char (*) [6])in_stack_fffffffffffff948._M_current,
               (anon_enum_32 *)in_stack_fffffffffffff940);
    local_f8 = (undefined1 ***)local_c8;
    local_110 = 4;
    std::
    pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>
    ::
    pair<const_char_(&)[6],_unicode_cpt_flags::(unnamed_enum_at__workspace_llm4binary_github_license_c_cmakelists_ggerganov[P]llama_src_unicode_h:8:5),_true>
              ((pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>
                *)in_stack_fffffffffffff950._M_current,
               (char (*) [6])in_stack_fffffffffffff948._M_current,
               (anon_enum_32 *)in_stack_fffffffffffff940);
    local_f8 = (undefined1 ***)local_a0;
    local_114 = 0x20;
    std::
    pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>
    ::
    pair<const_char_(&)[6],_unicode_cpt_flags::(unnamed_enum_at__workspace_llm4binary_github_license_c_cmakelists_ggerganov[P]llama_src_unicode_h:8:5),_true>
              ((pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>
                *)in_stack_fffffffffffff950._M_current,
               (char (*) [6])in_stack_fffffffffffff948._M_current,
               (anon_enum_32 *)in_stack_fffffffffffff940);
    local_f8 = (undefined1 ***)local_78;
    local_118 = 0x10;
    std::
    pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>
    ::
    pair<const_char_(&)[6],_unicode_cpt_flags::(unnamed_enum_at__workspace_llm4binary_github_license_c_cmakelists_ggerganov[P]llama_src_unicode_h:8:5),_true>
              ((pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>
                *)in_stack_fffffffffffff950._M_current,
               (char (*) [6])in_stack_fffffffffffff948._M_current,
               (anon_enum_32 *)in_stack_fffffffffffff940);
    local_f8 = (undefined1 ***)local_50;
    local_11c = 0x40;
    std::
    pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>
    ::
    pair<const_char_(&)[6],_unicode_cpt_flags::(unnamed_enum_at__workspace_llm4binary_github_license_c_cmakelists_ggerganov[P]llama_src_unicode_h:8:5),_true>
              ((pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>
                *)in_stack_fffffffffffff950._M_current,
               (char (*) [6])in_stack_fffffffffffff948._M_current,
               (anon_enum_32 *)in_stack_fffffffffffff940);
    local_28 = (undefined1 ***)local_f0;
    local_20 = 5;
    std::
    allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>
    ::allocator((allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>
                 *)0x55b0aa);
    __l_00._M_len = (size_type)in_stack_fffffffffffff980;
    __l_00._M_array = in_stack_fffffffffffff978;
    std::
    map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
    ::map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
           *)in_stack_fffffffffffff970,__l_00,
          (less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> *)
          CONCAT17(in_stack_fffffffffffff96f,in_stack_fffffffffffff968),in_stack_fffffffffffff960);
    std::
    allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>
    ::~allocator((allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>
                  *)0x55b0e5);
    local_540 = &local_28;
    do {
      local_540 = local_540 + -5;
      llama_vocab::std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>
      ::~pair((pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>
               *)0x55b11c);
    } while (local_540 != local_f0);
    __cxa_atexit(std::
                 map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                 ::~map,&unicode_regex_split(std::__cxx11::string_const&,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&)
                         ::k_ucat_enum_abi_cxx11_,&__dso_handle);
    __cxa_guard_release(&unicode_regex_split(std::__cxx11::string_const&,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&)
                         ::k_ucat_enum_abi_cxx11_);
  }
  if ((unicode_regex_split(std::__cxx11::string_const&,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&)
       ::k_ucat_cpt == '\0') &&
     (iVar5 = __cxa_guard_acquire(&unicode_regex_split(std::__cxx11::string_const&,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&)
                                   ::k_ucat_cpt), iVar5 != 0)) {
    local_148 = 0xd300000020;
    uStack_140 = 0xd400000010;
    local_158 = 0xd100000002;
    uStack_150 = 0xd200000004;
    local_138 = 0xd500000040;
    local_130 = &local_158;
    local_128 = 5;
    std::allocator<std::pair<const_int,_int>_>::allocator
              ((allocator<std::pair<const_int,_int>_> *)0x55b1e2);
    __l_01._M_len = (size_type)in_stack_fffffffffffff980;
    __l_01._M_array = (iterator)in_stack_fffffffffffff978;
    std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>::map
              ((map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_> *)
               in_stack_fffffffffffff970,__l_01,
               (less<int> *)CONCAT17(in_stack_fffffffffffff96f,in_stack_fffffffffffff968),
               (allocator_type *)in_stack_fffffffffffff960);
    std::allocator<std::pair<const_int,_int>_>::~allocator
              ((allocator<std::pair<const_int,_int>_> *)0x55b21d);
    __cxa_atexit(std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>::
                 ~map,&unicode_regex_split::k_ucat_cpt,&__dso_handle);
    __cxa_guard_release(&unicode_regex_split(std::__cxx11::string_const&,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&)
                         ::k_ucat_cpt);
  }
  if ((unicode_regex_split(std::__cxx11::string_const&,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&)
       ::k_ucat_map_abi_cxx11_ == '\0') &&
     (iVar5 = __cxa_guard_acquire(&unicode_regex_split(std::__cxx11::string_const&,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&)
                                   ::k_ucat_map_abi_cxx11_), iVar5 != 0)) {
    local_240 = &local_238;
    local_244 = 2;
    std::
    pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::
    pair<unicode_cpt_flags::(unnamed_enum_at__workspace_llm4binary_github_license_c_cmakelists_ggerganov[P]llama_src_unicode_h:8:5),_const_char_(&)[4],_true>
              ((pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)in_stack_fffffffffffff950._M_current,in_stack_fffffffffffff948._M_current,
               (char (*) [4])in_stack_fffffffffffff940);
    local_240 = (wstring *)local_210;
    local_248 = 4;
    std::
    pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::
    pair<unicode_cpt_flags::(unnamed_enum_at__workspace_llm4binary_github_license_c_cmakelists_ggerganov[P]llama_src_unicode_h:8:5),_const_char_(&)[7],_true>
              ((pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)in_stack_fffffffffffff950._M_current,in_stack_fffffffffffff948._M_current,
               (char (*) [7])in_stack_fffffffffffff940);
    local_240 = (wstring *)local_1e8;
    local_24c = 0x20;
    std::
    pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::
    pair<unicode_cpt_flags::(unnamed_enum_at__workspace_llm4binary_github_license_c_cmakelists_ggerganov[P]llama_src_unicode_h:8:5),_const_char_(&)[26],_true>
              ((pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)in_stack_fffffffffffff950._M_current,in_stack_fffffffffffff948._M_current,
               (char (*) [26])in_stack_fffffffffffff940);
    local_240 = (wstring *)local_1c0;
    local_250 = 0x10;
    std::
    pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::
    pair<unicode_cpt_flags::(unnamed_enum_at__workspace_llm4binary_github_license_c_cmakelists_ggerganov[P]llama_src_unicode_h:8:5),_const_char_(&)[1],_true>
              ((pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)in_stack_fffffffffffff950._M_current,in_stack_fffffffffffff948._M_current,
               (char (*) [1])in_stack_fffffffffffff940);
    local_240 = (wstring *)local_198;
    local_254 = 0x40;
    std::
    pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::
    pair<unicode_cpt_flags::(unnamed_enum_at__workspace_llm4binary_github_license_c_cmakelists_ggerganov[P]llama_src_unicode_h:8:5),_const_char_(&)[12],_true>
              ((pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)in_stack_fffffffffffff950._M_current,in_stack_fffffffffffff948._M_current,
               (char (*) [12])in_stack_fffffffffffff940);
    local_170 = &local_238;
    local_168 = 5;
    std::
    allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::allocator((allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)0x55b38b);
    __l_02._M_len = (size_type)in_stack_fffffffffffff980;
    __l_02._M_array = (iterator)in_stack_fffffffffffff978;
    std::
    map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::map(in_stack_fffffffffffff970,__l_02,
          (less<int> *)CONCAT17(in_stack_fffffffffffff96f,in_stack_fffffffffffff968),
          (allocator_type *)in_stack_fffffffffffff960);
    std::
    allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~allocator((allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)0x55b3c6);
    local_568 = (wstring *)&local_170;
    do {
      in_stack_fffffffffffffa88 = (wstring *)((long)&local_568[-2].field_2 + 8);
      std::
      pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::~pair((pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *)0x55b3fd);
      local_568 = in_stack_fffffffffffffa88;
    } while (in_stack_fffffffffffffa88 != &local_238);
    __cxa_atexit(std::
                 map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 ::~map,&unicode_regex_split(std::__cxx11::string_const&,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&)
                         ::k_ucat_map_abi_cxx11_,&__dso_handle);
    __cxa_guard_release(&unicode_regex_split(std::__cxx11::string_const&,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&)
                         ::k_ucat_map_abi_cxx11_);
  }
  local_257 = 0;
  local_260 = local_18;
  local_268._M_current =
       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
       std::
       vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)in_stack_fffffffffffff918);
  local_270 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
              std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)in_stack_fffffffffffff918);
  do {
    bVar3 = __gnu_cxx::operator!=
                      (in_stack_fffffffffffff920,
                       (__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                        *)in_stack_fffffffffffff918);
    if (!bVar3) {
      unicode_cpts_from_utf8
                ((string *)CONCAT17(in_stack_fffffffffffff96f,in_stack_fffffffffffff968));
      std::__cxx11::string::string(local_2d0);
      if ((local_257 & 1) != 0) {
        std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size
                  ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_2b0);
        std::__cxx11::string::resize((ulong)local_2d0);
        for (local_2d8 = 0; uVar13 = local_2d8,
            sVar6 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size
                              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_2b0),
            uVar13 < sVar6; local_2d8 = local_2d8 + 1) {
          pvVar7 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                             ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_2b0,
                              local_2d8);
          if (*pvVar7 < 0x80) {
            pvVar7 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                               ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_2b0,
                                local_2d8);
            vVar1 = *pvVar7;
            in_stack_fffffffffffffa28 =
                 (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)std::__cxx11::string::operator[]((ulong)local_2d0);
            *(char *)&(in_stack_fffffffffffffa28->
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      )._M_impl.super__Vector_impl_data._M_start = (char)vVar1;
          }
          else {
            std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                      ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_2b0,local_2d8);
            local_2da = unicode_cpt_flags_from_cpt(in_stack_fffffffffffff930);
            if (((ushort)local_2da >> 8 & 1) == 0) {
              uVar4 = unicode_cpt_flags::category_flag((unicode_cpt_flags *)0x55b931);
              local_2ec = (uint)uVar4;
              local_2e8._M_node =
                   (_Base_ptr)
                   std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>::
                   find((map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
                         *)in_stack_fffffffffffff918,(key_type *)0x55b961);
              local_2f8._M_node =
                   (_Base_ptr)
                   std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>::
                   end((map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_> *
                       )in_stack_fffffffffffff918);
              bVar3 = std::operator!=(&local_2e8,&local_2f8);
              if (bVar3) {
                uVar4 = unicode_cpt_flags::category_flag((unicode_cpt_flags *)0x55b9ba);
                local_2fc = (uint)uVar4;
                pmVar9 = std::
                         map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
                         ::at((map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
                               *)in_stack_fffffffffffff940,
                              (key_type *)
                              CONCAT44(in_stack_fffffffffffff93c,in_stack_fffffffffffff938));
                mVar2 = *pmVar9;
                puVar8 = (undefined1 *)std::__cxx11::string::operator[]((ulong)local_2d0);
                *puVar8 = (char)mVar2;
              }
              else {
                puVar8 = (undefined1 *)std::__cxx11::string::operator[]((ulong)local_2d0);
                *puVar8 = 0xd0;
              }
            }
            else {
              puVar8 = (undefined1 *)std::__cxx11::string::operator[]((ulong)local_2d0);
              *puVar8 = 0xb;
            }
          }
        }
      }
      local_330 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size
                            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_2b0);
      local_328 = &local_330;
      local_320 = 1;
      std::allocator<unsigned_long>::allocator((allocator<unsigned_long> *)0x55bac6);
      __l._M_array._6_2_ = in_stack_fffffffffffff95e;
      __l._M_array._0_6_ = in_stack_fffffffffffff958;
      __l._M_len = (size_type)in_stack_fffffffffffff960;
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
                ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                 in_stack_fffffffffffff950._M_current,__l,
                 (allocator_type *)in_stack_fffffffffffff948._M_current);
      std::allocator<unsigned_long>::~allocator((allocator<unsigned_long> *)0x55bafa);
      local_340 = local_18;
      local_348._M_current =
           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
           std::
           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)in_stack_fffffffffffff918);
      local_350 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                  std::
                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)in_stack_fffffffffffff918);
      do {
        bVar3 = __gnu_cxx::operator!=
                          (in_stack_fffffffffffff920,
                           (__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                            *)in_stack_fffffffffffff918);
        if (!bVar3) {
          this_01 = local_4d0;
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)0x55c65f);
          std::vector<unsigned_long,_std::allocator<unsigned_long>_>::size(&local_318);
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::reserve((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)in_stack_fffffffffffff950._M_current,
                    (size_type)in_stack_fffffffffffff948._M_current);
          local_4d8 = 0;
          local_4e0 = &local_318;
          local_4e8._M_current =
               (unsigned_long *)
               std::vector<unsigned_long,_std::allocator<unsigned_long>_>::begin
                         ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                          in_stack_fffffffffffff918);
          local_4f0 = (unsigned_long *)
                      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::end
                                ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                                 in_stack_fffffffffffff918);
          while (bVar3 = __gnu_cxx::operator!=
                                   ((__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                                     *)this_01,
                                    (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                                     *)in_stack_fffffffffffff918), bVar3) {
            local_4f8 = __gnu_cxx::
                        __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                        ::operator*(&local_4e8);
            llama_vocab::std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::emplace_back<>(this_01);
            for (local_500 = local_4d8; local_500 < local_4d8 + *local_4f8;
                local_500 = local_500 + 1) {
              std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                        ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_2b0,local_500
                        );
              unicode_cpt_to_utf8_abi_cxx11_(in_stack_fffffffffffff93c);
              this_00 = std::
                        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ::back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                *)this_01);
              std::__cxx11::string::operator+=((string *)this_00,local_520);
              std::__cxx11::string::~string(local_520);
            }
            local_4d8 = *local_4f8 + local_4d8;
            __gnu_cxx::
            __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
            ::operator++(&local_4e8);
          }
          unicode_byte_encoding_process(in_stack_fffffffffffffa28);
          local_374 = 1;
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)CONCAT44(in_stack_fffffffffffff934,in_stack_fffffffffffff930));
          std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
                    ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                     CONCAT44(in_stack_fffffffffffff934,in_stack_fffffffffffff930));
          std::__cxx11::string::~string(local_2d0);
          std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
                    ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                     CONCAT44(in_stack_fffffffffffff934,in_stack_fffffffffffff930));
          return in_RDI;
        }
        local_358 = __gnu_cxx::
                    __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                    ::operator*(&local_348);
        unicode_regex_split_custom
                  (in_stack_fffffffffffff988,in_stack_fffffffffffff980,
                   (vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                   in_stack_fffffffffffff978);
        bVar3 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::empty
                          ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                           CONCAT44(in_stack_fffffffffffff934,in_stack_fffffffffffff930));
        if (bVar3) {
          local_375 = 0;
          local_380 = &unicode_regex_split(std::__cxx11::string_const&,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&)
                       ::k_ucat_enum_abi_cxx11_;
          local_388._M_node =
               (_Base_ptr)
               std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
               ::begin(in_stack_fffffffffffff918);
          local_390._M_node =
               (_Base_ptr)
               std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
               ::end(in_stack_fffffffffffff918);
          while (bVar3 = std::operator!=(&local_388,&local_390), bVar3) {
            local_398 = std::
                        _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>
                        ::operator*((_Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>
                                     *)0x55bc6a);
            lVar10 = std::__cxx11::string::find((string *)local_358,(ulong)local_398);
            if (lVar10 != -1) {
              local_375 = 1;
              break;
            }
            std::
            _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>
            ::operator++((_Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>
                          *)in_stack_fffffffffffff920);
          }
          if ((local_375 & 1) == 0) {
            unicode_wstring_from_utf8(in_stack_fffffffffffff998);
            in_stack_fffffffffffff980 = &local_2b0;
            local_478 = (uint *)std::vector<unsigned_int,_std::allocator<unsigned_int>_>::begin
                                          ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                                           in_stack_fffffffffffff918);
            local_481._1_8_ =
                 std::vector<unsigned_int,_std::allocator<unsigned_int>_>::end
                           ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                            in_stack_fffffffffffff918);
            in_stack_fffffffffffff988 = (string *)local_481;
            std::allocator<wchar_t>::allocator();
            std::__cxx11::wstring::
            wstring<__gnu_cxx::__normal_iterator<unsigned_int_const*,std::vector<unsigned_int,std::allocator<unsigned_int>>>,void>
                      (in_stack_fffffffffffff940,in_stack_fffffffffffff950,in_stack_fffffffffffff948
                       ,(allocator<wchar_t> *)
                        CONCAT44(in_stack_fffffffffffff93c,in_stack_fffffffffffff938));
            std::allocator<wchar_t>::~allocator((allocator<wchar_t> *)local_481);
            local_490 = (iterator)0x0;
            while (in_stack_fffffffffffff978 = local_490,
                  ppVar15 = (iterator)std::__cxx11::wstring::size(),
                  in_stack_fffffffffffff978 < ppVar15) {
              piVar16 = (int *)std::__cxx11::wstring::operator[]((ulong)local_470);
              in_stack_fffffffffffff96f = false;
              if (0x7f < *piVar16) {
                std::__cxx11::wstring::operator[]((ulong)local_470);
                local_492 = unicode_cpt_flags_from_cpt(in_stack_fffffffffffff930);
                in_stack_fffffffffffff96f = ((ushort)local_492 >> 8 & 1) != 0;
              }
              if ((bool)in_stack_fffffffffffff96f != false) {
                in_stack_fffffffffffff950._M_current =
                     (uint *)std::__cxx11::wstring::operator[]((ulong)local_470);
                *(undefined4 *)
                 &((pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>
                    *)in_stack_fffffffffffff950._M_current)->first = 0xb;
              }
              local_490 = (iterator)&(local_490->first).field_0x1;
            }
            unicode_regex_split_stl
                      (in_stack_fffffffffffffa88,in_stack_fffffffffffffa80,in_stack_fffffffffffffa78
                      );
            std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator=
                      ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                       CONCAT44(in_stack_fffffffffffff934,in_stack_fffffffffffff930),
                       in_stack_fffffffffffff928);
            std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
                      ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                       CONCAT44(in_stack_fffffffffffff934,in_stack_fffffffffffff930));
            std::__cxx11::wstring::~wstring(local_470);
            std::__cxx11::wstring::~wstring(local_450);
          }
          else {
            unicode_cpts_from_utf8
                      ((string *)CONCAT17(in_stack_fffffffffffff96f,in_stack_fffffffffffff968));
            for (local_3b8 = 0; uVar13 = local_3b8,
                sVar6 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size(&local_3b0),
                uVar13 < sVar6; local_3b8 = local_3b8 + 1) {
              pvVar7 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                                 (&local_3b0,local_3b8);
              if (0x7f < *pvVar7) {
                this = (runtime_error *)__cxa_allocate_exception(0x10);
                std::runtime_error::runtime_error
                          (this,
                           "Regex includes both unicode categories and non-ASCII characters - not supported"
                          );
                __cxa_throw(this,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
              }
            }
            std::__cxx11::string::string(local_3d8);
            local_3d9 = 0;
            for (local_3e8 = 0; uVar13 = local_3e8, uVar11 = std::__cxx11::string::size(),
                uVar13 < uVar11; local_3e8 = local_3e8 + 1) {
              pcVar12 = (char *)std::__cxx11::string::operator[]((ulong)local_358);
              if ((*pcVar12 == '[') &&
                 ((local_3e8 == 0 ||
                  (pcVar12 = (char *)std::__cxx11::string::operator[]((ulong)local_358),
                  *pcVar12 != '\\')))) {
                std::__cxx11::string::operator+=(local_3d8,'[');
                local_3d9 = 1;
              }
              else if (((local_3d9 & 1) == 0) ||
                      ((pcVar12 = (char *)std::__cxx11::string::operator[]((ulong)local_358),
                       *pcVar12 != ']' ||
                       (pcVar12 = (char *)std::__cxx11::string::operator[]((ulong)local_358),
                       *pcVar12 == '\\')))) {
                pcVar12 = (char *)std::__cxx11::string::operator[]((ulong)local_358);
                if (((*pcVar12 == '\\') &&
                    (((uVar13 = local_3e8 + 4, uVar11 = std::__cxx11::string::size(),
                      uVar13 < uVar11 &&
                      (pcVar12 = (char *)std::__cxx11::string::operator[]((ulong)local_358),
                      *pcVar12 == 'p')) &&
                     (pcVar12 = (char *)std::__cxx11::string::operator[]((ulong)local_358),
                     *pcVar12 == '{')))) &&
                   (pcVar12 = (char *)std::__cxx11::string::operator[]((ulong)local_358),
                   *pcVar12 == '}')) {
                  std::__cxx11::string::substr((ulong)local_408,(ulong)local_358);
                  local_410._M_node =
                       (_Base_ptr)
                       std::
                       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                       ::find(in_stack_fffffffffffff918,(key_type *)0x55c030);
                  local_418._M_node =
                       (_Base_ptr)
                       std::
                       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                       ::end(in_stack_fffffffffffff918);
                  bVar3 = std::operator!=(&local_410,&local_418);
                  if (bVar3) {
                    if ((local_3d9 & 1) == 0) {
                      std::__cxx11::string::operator+=(local_3d8,'[');
                    }
                    std::
                    map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                    ::at((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                          *)in_stack_fffffffffffff940,
                         (key_type *)CONCAT44(in_stack_fffffffffffff93c,in_stack_fffffffffffff938));
                    pmVar9 = std::
                             map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
                             ::at((map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
                                   *)in_stack_fffffffffffff940,
                                  (key_type *)
                                  CONCAT44(in_stack_fffffffffffff93c,in_stack_fffffffffffff938));
                    std::__cxx11::string::operator+=(local_3d8,(char)*pmVar9);
                    in_stack_fffffffffffff998 =
                         (string *)
                         std::
                         map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                         ::at((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                               *)in_stack_fffffffffffff940,
                              (key_type *)
                              CONCAT44(in_stack_fffffffffffff93c,in_stack_fffffffffffff938));
                    pmVar14 = std::
                              map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                              ::at((map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                    *)in_stack_fffffffffffff940,
                                   (key_type *)
                                   CONCAT44(in_stack_fffffffffffff93c,in_stack_fffffffffffff938));
                    std::__cxx11::string::operator+=(local_3d8,(string *)pmVar14);
                    if ((local_3d9 & 1) == 0) {
                      std::__cxx11::string::operator+=(local_3d8,']');
                    }
                    local_3e8 = local_3e8 + 4;
                    local_374 = 0x12;
                  }
                  else {
                    local_374 = 0;
                  }
                  std::__cxx11::string::~string(local_408);
                  if (local_374 != 0) goto LAB_0055c1f8;
                }
                pcVar12 = (char *)std::__cxx11::string::operator[]((ulong)local_358);
                std::__cxx11::string::operator+=(local_3d8,*pcVar12);
              }
              else {
                std::__cxx11::string::operator+=(local_3d8,']');
                local_3d9 = 0;
              }
LAB_0055c1f8:
            }
            unicode_regex_split_stl
                      ((string *)in_stack_fffffffffffffa88,(string *)in_stack_fffffffffffffa80,
                       in_stack_fffffffffffffa78);
            std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator=
                      ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                       CONCAT44(in_stack_fffffffffffff934,in_stack_fffffffffffff930),
                       in_stack_fffffffffffff928);
            std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
                      ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                       CONCAT44(in_stack_fffffffffffff934,in_stack_fffffffffffff930));
            std::__cxx11::string::~string(local_3d8);
            std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
                      ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                       CONCAT44(in_stack_fffffffffffff934,in_stack_fffffffffffff930));
          }
          local_374 = 0;
        }
        else {
          std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator=
                    ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                     CONCAT44(in_stack_fffffffffffff934,in_stack_fffffffffffff930),
                     in_stack_fffffffffffff928);
          local_374 = 10;
        }
        std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
                  ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                   CONCAT44(in_stack_fffffffffffff934,in_stack_fffffffffffff930));
        __gnu_cxx::
        __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ::operator++(&local_348);
      } while( true );
    }
    local_278 = __gnu_cxx::
                __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                ::operator*(&local_268);
    local_280 = &unicode_regex_split(std::__cxx11::string_const&,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&)
                 ::k_ucat_enum_abi_cxx11_;
    local_288._M_node =
         (_Base_ptr)
         std::
         map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
         ::begin(in_stack_fffffffffffff918);
    local_290._M_node =
         (_Base_ptr)
         std::
         map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
         ::end(in_stack_fffffffffffff918);
    while (bVar3 = std::operator!=(&local_288,&local_290), bVar3) {
      local_2b0.field_2._8_8_ =
           std::
           _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>
           ::operator*((_Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>
                        *)0x55b517);
      lVar10 = std::__cxx11::string::find((string *)local_278,local_2b0.field_2._8_8_);
      if (lVar10 != -1) {
        local_257 = 1;
        break;
      }
      std::
      _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>
      ::operator++((_Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>
                    *)in_stack_fffffffffffff920);
    }
    __gnu_cxx::
    __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::operator++(&local_268);
  } while( true );
}

Assistant:

std::vector<std::string> unicode_regex_split(const std::string & text, const std::vector<std::string> & regex_exprs) {
    // unicode categories
    static const std::map<std::string, int> k_ucat_enum = {
        { "\\p{N}", unicode_cpt_flags::NUMBER },
        { "\\p{L}", unicode_cpt_flags::LETTER },
        { "\\p{P}", unicode_cpt_flags::PUNCTUATION },
        { "\\p{M}", unicode_cpt_flags::ACCENT_MARK },
        { "\\p{S}", unicode_cpt_flags::SYMBOL },
    };

    static const std::map<int, int> k_ucat_cpt = {
        { unicode_cpt_flags::NUMBER,      0xD1 },
        { unicode_cpt_flags::LETTER,      0xD2 },
        { unicode_cpt_flags::PUNCTUATION, 0xD3 },
        { unicode_cpt_flags::ACCENT_MARK, 0xD4 },
        { unicode_cpt_flags::SYMBOL,      0xD5 },
    };

    static const std::map<int, std::string> k_ucat_map = {
        { unicode_cpt_flags::NUMBER,      "\x30-\x39" }, // 0-9
        { unicode_cpt_flags::LETTER,      "\x41-\x5A\x61-\x7A" }, // A-Za-z
        { unicode_cpt_flags::PUNCTUATION, "\x21-\x23\x25-\x2A\x2C-\x2F\x3A-\x3B\x3F-\x40\\\x5B-\\\x5D\x5F\\\x7B\\\x7D" }, // !-#%-*,-/:-;?-@\[-\]_\{\}
        { unicode_cpt_flags::ACCENT_MARK, "" }, // no sub-128 codepoints
        { unicode_cpt_flags::SYMBOL,      "\\\x24\\\x2B\x3C-\x3E\x5E\x60\\\x7C" }, // $+<=>^`|
    };

    // compute collapsed codepoints only if needed by at least one regex
    bool need_collapse = false;
    for (const auto & regex_expr : regex_exprs) {
        // search for unicode categories
        for (const auto & ucat : k_ucat_enum) {
            if (std::string::npos != regex_expr.find(ucat.first)) {
                need_collapse = true;
                break;
            }
        }
    }

    const auto cpts = unicode_cpts_from_utf8(text);

    // generate a "collapsed" representation of the text, where all codepoints are replaced by a single byte
    // ref: https://github.com/ggml-org/llama.cpp/pull/6920#issuecomment-2081479935
    std::string text_collapsed;
    if (need_collapse) {
        // collapse all unicode categories
        text_collapsed.resize(cpts.size());

        for (size_t i = 0; i < cpts.size(); ++i) {
            // keep single-byte codepoints as is
            if (cpts[i] < 128) {
                text_collapsed[i] = cpts[i];
                continue;
            }

            const auto flags = unicode_cpt_flags_from_cpt(cpts[i]);

            if (flags.is_whitespace) {
                //NOTE: C++ std::regex \s does not mach 0x85, Rust and Python regex does.
                //text_collapsed[i] = (char) 0x85;  // <Next Line> as whitespace fallback
                text_collapsed[i] = (char) 0x0B;    // <vertical tab> as whitespace fallback
            } else if (k_ucat_cpt.find(flags.category_flag()) != k_ucat_cpt.end()) {
                text_collapsed[i] = k_ucat_cpt.at(flags.category_flag());
            } else {
                text_collapsed[i] = (char) 0xD0; // fallback
            }
        }
    }

    std::vector<size_t> bpe_offsets = { cpts.size() };

    for (const auto & regex_expr : regex_exprs) {
        // first, see if we have an efficient custom regex implementation
        auto tmp = unicode_regex_split_custom(text, regex_expr, bpe_offsets);

        if (!tmp.empty()) {
            bpe_offsets = std::move(tmp);
            continue;
        }

        // fallback to general-purpose std::regex / std::wregex
        try {
            // if a unicode category is used in the regex, we use the collapsed text and replace the unicode category
            // with the corresponding collapsed representation
            bool use_collapsed = false;
            for (const auto & ucat : k_ucat_enum) {
                if (std::string::npos != regex_expr.find(ucat.first)) {
                    use_collapsed = true;
                    break;
                }
            }

            if (use_collapsed) {
                // sanity-check that the original regex does not contain any non-ASCII characters
                const auto cpts_regex = unicode_cpts_from_utf8(regex_expr);
                for (size_t i = 0; i < cpts_regex.size(); ++i) {
                    if (cpts_regex[i] >= 128) {
                        throw std::runtime_error("Regex includes both unicode categories and non-ASCII characters - not supported");
                    }
                }

                // generate a collapsed representation of the regex
                std::string regex_expr_collapsed;

                // track if we are inside [], because nested [] are not allowed
                bool inside = false;
                for (size_t i = 0; i < regex_expr.size(); ++i) {
                    if (regex_expr[i] == '[' && (i == 0 || regex_expr[i - 1] != '\\')) {
                        regex_expr_collapsed += '[';
                        inside = true;
                        continue;
                    }

                    if (inside && regex_expr[i] == ']' && regex_expr[i - 1] != '\\') {
                        regex_expr_collapsed += ']';
                        inside = false;
                        continue;
                    }

                    if (regex_expr[i + 0] == '\\' && i + 4 < regex_expr.size() &&
                        regex_expr[i + 1] == 'p' &&
                        regex_expr[i + 2] == '{' &&
                        regex_expr[i + 4] == '}') {
                        const std::string pat = regex_expr.substr(i, 5);
                        if (k_ucat_enum.find(pat) != k_ucat_enum.end()) {
                            if (!inside) {
                                regex_expr_collapsed += '[';
                            }
                            regex_expr_collapsed += k_ucat_cpt.at(k_ucat_enum.at(pat));
                            regex_expr_collapsed += k_ucat_map.at(k_ucat_enum.at(pat));
                            if (!inside) {
                                regex_expr_collapsed += ']';
                            }
                            i += 4;
                            continue;
                        }
                    }

                    regex_expr_collapsed += regex_expr[i];
                }

                //printf("text_collapsed: %s\n", text_collapsed.c_str());
                //printf("regex_expr_collapsed: %s\n", regex_expr_collapsed.c_str());
                bpe_offsets = unicode_regex_split_stl(text_collapsed, regex_expr_collapsed, bpe_offsets);
            } else {
                // no unicode category used, we can use std::wregex directly
                const std::wstring wregex_expr = unicode_wstring_from_utf8(regex_expr);

                // std::wregex \s does not mach non-ASCII whitespaces, using 0x0B as fallback
                std::wstring wtext(cpts.begin(), cpts.end());
                for (size_t i = 0; i < wtext.size(); ++i) {
                    if (wtext[i] > 0x7F && unicode_cpt_flags_from_cpt(wtext[i]).is_whitespace) {
                        wtext[i] = 0x0B;
                    }
                }

                //printf("text: %s\n", text.c_str());
                //printf("regex_expr: %s\n", regex_expr.c_str());
                bpe_offsets = unicode_regex_split_stl(wtext, wregex_expr, bpe_offsets);
            }
        } catch (std::regex_error & e) {
            fprintf(stderr, "Failed to process regex: '%s'\n", regex_expr.c_str());
            fprintf(stderr, "Regex error: %s\n", e.what());
            throw std::runtime_error("Failed to process regex");
        }
    }

    std::vector<std::string> bpe_words;
    bpe_words.reserve(bpe_offsets.size()); // reserve memory for the approximate size

    size_t start = 0;
    for (size_t & offset : bpe_offsets) {
        bpe_words.emplace_back();
        for (size_t i = start; i < start + offset; ++i) {
            bpe_words.back() += unicode_cpt_to_utf8(cpts[i]);
        }
        start += offset;
    }

    return unicode_byte_encoding_process(bpe_words);
}